

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_HelloRetryRequest_Test::TestBody
          (QUICMethodTest_HelloRetryRequest_Test *this)

{
  internal iVar1;
  int iVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  SSL_QUIC_METHOD quic_method;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  AssertHelper local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_60;
  SSL_QUIC_METHOD local_40;
  
  local_40.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  local_40.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  local_40.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  local_40.flush_flight = QUICMethodTest::FlushFlightCallback;
  local_40.send_alert = QUICMethodTest::SendAlertCallback;
  iVar2 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_40);
  local_70[0] = (internal)(iVar2 != 0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,local_70,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1cd5,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
  }
  else {
    iVar2 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_40);
    local_70[0] = (internal)(iVar2 != 0);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,local_70,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1cd6,local_60._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    }
    else {
      iVar2 = SSL_CTX_set1_groups((this->super_QUICMethodTest).client_ctx_._M_t.
                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                  TestBody::kClientPrefs,2);
      local_70[0] = (internal)(iVar2 != 0);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_60,local_70,
                   (AssertionResult *)
                   "SSL_CTX_set1_groups(client_ctx_.get(), kClientPrefs, (sizeof(kClientPrefs) / sizeof((kClientPrefs)[0])))"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1cdc,local_60._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      }
      else {
        iVar2 = SSL_CTX_set1_groups((this->super_QUICMethodTest).server_ctx_._M_t.
                                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                    TestBody::kServerPrefs,2);
        local_70[0] = (internal)(iVar2 != 0);
        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_70[0]) {
          iVar1 = (internal)QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_70[0] = iVar1;
          if (!(bool)iVar1) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_60,local_70,(AssertionResult *)"CreateClientAndServer()","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1ce1,local_60._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if (local_80._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_80._M_head_impl + 8))();
            }
            if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_68,local_68);
            }
            if (!(bool)iVar1) {
              return;
            }
          }
          iVar1 = (internal)
                  QUICMethodTest::RunQUICHandshakesAndExpectError
                            (&this->super_QUICMethodTest,kNoError);
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_70[0] = iVar1;
          if (!(bool)iVar1) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_60,local_70,(AssertionResult *)"CompleteHandshakesForQUIC()","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1ce2,local_60._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if (local_80._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_80._M_head_impl + 8))();
            }
            if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_68,local_68);
            }
            if (!(bool)iVar1) {
              return;
            }
          }
          QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
          return;
        }
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_60,local_70,
                   (AssertionResult *)
                   "SSL_CTX_set1_groups(server_ctx_.get(), kServerPrefs, (sizeof(kServerPrefs) / sizeof((kServerPrefs)[0])))"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1cdf,local_60._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_80._M_head_impl + 8))();
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, HelloRetryRequest) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  // BoringSSL predicts the most preferred ECDH group, so using different
  // preferences will trigger HelloRetryRequest.
  static const int kClientPrefs[] = {NID_X25519, NID_X9_62_prime256v1};
  ASSERT_TRUE(SSL_CTX_set1_groups(client_ctx_.get(), kClientPrefs,
                                  OPENSSL_ARRAY_SIZE(kClientPrefs)));
  static const int kServerPrefs[] = {NID_X9_62_prime256v1, NID_X25519};
  ASSERT_TRUE(SSL_CTX_set1_groups(server_ctx_.get(), kServerPrefs,
                                  OPENSSL_ARRAY_SIZE(kServerPrefs)));

  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(CompleteHandshakesForQUIC());
  ExpectHandshakeSuccess();
}